

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O0

void __thiscall glu::TextureCube::upload(TextureCube *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deBool dVar4;
  deUint32 dVar5;
  int iVar6;
  deUint32 dVar7;
  int iVar8;
  undefined4 extraout_var;
  TestError *this_00;
  TextureFormat *pTVar10;
  TransferFormat TVar11;
  ConstPixelBufferAccess *pCVar12;
  void *pvVar13;
  undefined1 local_70 [8];
  ConstPixelBufferAccess access;
  CubeFace local_40;
  int levelNdx;
  int face;
  deUint32 local_34;
  deUint32 dStack_30;
  TransferFormat transferFormat;
  Functions *gl;
  TextureCube *this_local;
  long lVar9;
  
  iVar3 = (*this->m_context->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar3);
  while ((dVar4 = ::deGetFalse(), dVar4 == 0 && (this->m_glTexture != 0))) {
    dVar4 = ::deGetFalse();
    if (dVar4 == 0) {
      (**(code **)(lVar9 + 0xb8))(0x8513,this->m_glTexture);
      pcVar1 = *(code **)(lVar9 + 0xff0);
      pTVar10 = tcu::TextureCube::getFormat(&this->m_refTexture);
      iVar3 = computePixelStore(pTVar10);
      (*pcVar1)(0xcf5,iVar3);
      dVar5 = (**(code **)(lVar9 + 0x800))();
      checkError(dVar5,"Texture upload failed",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                 ,0x185);
      pTVar10 = tcu::TextureCube::getFormat(&this->m_refTexture);
      TVar11 = getTransferFormat(*pTVar10);
      for (local_40 = CUBEFACE_NEGATIVE_X; (int)local_40 < 6;
          local_40 = local_40 + CUBEFACE_POSITIVE_X) {
        for (access.m_data._4_4_ = 0; iVar3 = access.m_data._4_4_,
            iVar6 = tcu::TextureCube::getNumLevels(&this->m_refTexture), iVar3 < iVar6;
            access.m_data._4_4_ = access.m_data._4_4_ + 1) {
          bVar2 = tcu::TextureCube::isLevelEmpty(&this->m_refTexture,local_40,access.m_data._4_4_);
          if (!bVar2) {
            pCVar12 = &tcu::TextureCube::getLevelFace
                                 (&this->m_refTexture,access.m_data._4_4_,local_40)->
                       super_ConstPixelBufferAccess;
            tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                      ((ConstPixelBufferAccess *)local_70,pCVar12);
            pcVar1 = *(code **)(lVar9 + 0x1310);
            dVar7 = getGLCubeFace(local_40);
            iVar3 = access.m_data._4_4_;
            dVar5 = this->m_format;
            iVar6 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)local_70);
            iVar8 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)local_70);
            local_34 = TVar11.format;
            dStack_30 = TVar11.dataType;
            pvVar13 = tcu::ConstPixelBufferAccess::getDataPtr((ConstPixelBufferAccess *)local_70);
            (*pcVar1)(dVar7,iVar3,dVar5,iVar6,iVar8,0,local_34,dStack_30,pvVar13);
          }
        }
      }
      dVar5 = (**(code **)(lVar9 + 0x800))();
      checkError(dVar5,"Texture upload failed",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                 ,0x196);
      return;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"m_glTexture",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x182);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void TextureCube::upload (void)
{
	const glw::Functions& gl = m_context.getFunctions();

	DE_ASSERT(!m_isCompressed);

	TCU_CHECK(m_glTexture);
	gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_glTexture);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, computePixelStore(m_refTexture.getFormat()));
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");

	TransferFormat transferFormat = getTransferFormat(m_refTexture.getFormat());

	for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
	{
		for (int levelNdx = 0; levelNdx < m_refTexture.getNumLevels(); levelNdx++)
		{
			if (m_refTexture.isLevelEmpty((tcu::CubeFace)face, levelNdx))
				continue; // Don't upload.

			tcu::ConstPixelBufferAccess access = m_refTexture.getLevelFace(levelNdx, (tcu::CubeFace)face);
			DE_ASSERT(access.getRowPitch() == access.getFormat().getPixelSize()*access.getWidth());
			gl.texImage2D(getGLCubeFace((tcu::CubeFace)face), levelNdx, m_format, access.getWidth(), access.getHeight(), 0 /* border */, transferFormat.format, transferFormat.dataType, access.getDataPtr());
		}
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");
}